

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

shared_ptr<gui::TextBox> gui::TextBox::create(shared_ptr<gui::TextBoxStyle> *style,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::TextBox> sVar1;
  String *unaff_retaddr;
  shared_ptr<gui::TextBoxStyle> *in_stack_00000008;
  TextBox *in_stack_00000010;
  element_type *this;
  
  this = in_RDI;
  operator_new(0x3a8);
  std::shared_ptr<gui::TextBoxStyle>::shared_ptr
            ((shared_ptr<gui::TextBoxStyle> *)this,(shared_ptr<gui::TextBoxStyle> *)in_RDI);
  TextBox(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::shared_ptr<gui::TextBox>::shared_ptr<gui::TextBox,void>
            ((shared_ptr<gui::TextBox> *)this,in_RDI);
  std::shared_ptr<gui::TextBoxStyle>::~shared_ptr((shared_ptr<gui::TextBoxStyle> *)0x1d9096);
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::TextBox>)
         sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextBox> TextBox::create(std::shared_ptr<TextBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<TextBox>(new TextBox(style, name));
}